

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O1

size_t mi_good_size(size_t size)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (size < 0x10001) {
    uVar1 = size + 7 >> 3;
    if (size < 0x41) {
      uVar3 = 1;
      if (8 < size) {
        uVar3 = (ulong)((int)uVar1 + 1U & 0x1e);
      }
    }
    else {
      uVar1 = uVar1 - 1;
      uVar3 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = ((ulong)((uint)(uVar1 >> (0x3dU - (char)(uVar3 ^ 0x3f) & 0x3f)) & 3) +
               ((uVar3 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
    }
    sVar2 = _mi_heap_empty.pages[uVar3].block_size;
  }
  else {
    sVar2 = _mi_os_page_size();
    uVar1 = (sVar2 + size) - 1;
    if ((sVar2 & sVar2 - 1) == 0) {
      sVar2 = uVar1 & -sVar2;
    }
    else {
      sVar2 = uVar1 - uVar1 % sVar2;
    }
  }
  return sVar2;
}

Assistant:

size_t mi_good_size(size_t size) mi_attr_noexcept {
  if (size <= MI_MEDIUM_OBJ_SIZE_MAX) {
    return _mi_bin_size(mi_bin(size + MI_PADDING_SIZE));
  }
  else {
    return _mi_align_up(size + MI_PADDING_SIZE,_mi_os_page_size());
  }
}